

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
duckdb_fmt::v6::internal::basic_writer<duckdb_fmt::v6::buffer_range<char>>::
int_writer<unsigned__int128,duckdb_fmt::v6::basic_format_specs<char>>::dec_writer::operator()
          (dec_writer *this,char **it)

{
  int iVar1;
  undefined1 auVar2 [16];
  byte bVar3;
  long lVar4;
  char *__dest;
  undefined1 *puVar5;
  ulong uVar6;
  ulong uVar7;
  size_t __n;
  undefined1 auVar8 [16];
  char buffer [78];
  undefined1 local_88 [88];
  
  __dest = *it;
  auVar8 = *(undefined1 (*) [16])this;
  auVar2 = *(undefined1 (*) [16])this;
  iVar1 = *(int *)(this + 0x10);
  __n = (size_t)iVar1;
  puVar5 = local_88 + __n;
  if ((ulong)(*(ulong *)this < 100) <= *(ulong *)(this + 8)) {
    do {
      lVar4 = auVar2._8_8_;
      uVar7 = auVar2._0_8_;
      auVar8 = __udivti3(uVar7,lVar4,100,0);
      uVar6 = (ulong)(uint)(auVar2._0_4_ + auVar8._0_4_ * -100);
      puVar5[-1] = basic_data<void>::digits[(uVar6 * 2 & 0xffffffff) + 1];
      puVar5[-2] = basic_data<void>::digits[uVar6 * 2];
      puVar5 = puVar5 + -2;
      auVar2 = auVar8;
    } while (lVar4 != 0 || (ulong)-lVar4 < (ulong)(9999 < uVar7));
  }
  if (auVar8._8_8_ == 0 && (ulong)(9 < auVar8._0_8_) <= (ulong)-auVar8._8_8_) {
    bVar3 = auVar8[0] | 0x30;
    lVar4 = -1;
  }
  else {
    uVar6 = auVar8._0_8_ * 2;
    puVar5[-1] = basic_data<void>::digits[(uVar6 & 0xffffffff) + 1];
    bVar3 = basic_data<void>::digits[uVar6 & 0x1fffffffe];
    lVar4 = -2;
  }
  puVar5[lVar4] = bVar3;
  if (iVar1 != 0) {
    switchD_00b03519::default(__dest,local_88,__n);
    __dest = __dest + __n;
  }
  *it = __dest;
  return;
}

Assistant:

void operator()(It&& it) const {
        it = internal::format_decimal<char_type>(it, abs_value, num_digits);
      }